

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool redo_cmd_active_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_48;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object last_command;
  Am_Object undo_handler;
  Am_Object *self_local;
  
  Am_Object::Am_Object(&last_command);
  Am_Object::Am_Object(&local_28);
  Am_Object::Am_Object(&local_48,self);
  GV_undo_handler_from_cmd(local_40);
  Am_Object::operator=(&last_command,local_40);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(&local_48);
  bVar1 = Am_Object::Valid(&last_command);
  if (bVar1) {
    in_value = Am_Object::Get(&last_command,0x179,0);
    Am_Object::operator=(&local_28,in_value);
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      self_local._7_1_ = true;
      goto LAB_0031f65b;
    }
  }
  self_local._7_1_ = false;
LAB_0031f65b:
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&last_command);
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, redo_cmd_active)
{
  Am_Object undo_handler, last_command;
  undo_handler = GV_undo_handler_from_cmd(self);
  if (undo_handler.Valid()) {
    last_command = undo_handler.Get(Am_REDO_ALLOWED);
    if (last_command.Valid())
      return true;
  }
  return false;
}